

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaBinrIO.cpp
# Opt level: O0

bool __thiscall NaBinaryStreamFile::GoNextRecord(NaBinaryStreamFile *this)

{
  int iVar1;
  size_t sVar2;
  undefined4 *puVar3;
  long in_RDI;
  bool local_1;
  
  iVar1 = *(int *)(in_RDI + 0x38);
  sVar2 = fread(*(void **)(in_RDI + 0x30),*(size_t *)(in_RDI + 0x40),(long)*(int *)(in_RDI + 0x38),
                *(FILE **)(in_RDI + 0x20));
  if ((long)iVar1 == sVar2) {
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
    local_1 = true;
  }
  else {
    iVar1 = feof(*(FILE **)(in_RDI + 0x20));
    if (iVar1 == 0) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 7;
      __cxa_throw(puVar3,&NaException::typeinfo,0);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
NaBinaryStreamFile::GoNextRecord ()
{
  if(nVar != fread(vCurLine, nDataSize, nVar, fp))
    {
      if(feof(fp))
	return false;
      throw(na_read_error);
    }
  ++iCurLine;

  return true;
}